

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int aec_decode_count_offsets(aec_stream_conflict *strm,size_t *count)

{
  size_t sVar1;
  internal_state_conflict *state;
  size_t *count_local;
  aec_stream_conflict *strm_local;
  
  if (strm->state->offsets == (vector_t *)0x0) {
    *count = 0;
    strm_local._4_4_ = -5;
  }
  else {
    sVar1 = vector_size(strm->state->offsets);
    *count = sVar1;
    strm_local._4_4_ = 0;
  }
  return strm_local._4_4_;
}

Assistant:

int aec_decode_count_offsets(struct aec_stream *strm, size_t *count)
{
    struct internal_state *state = strm->state;
    if (state->offsets == NULL) {
        *count = 0;
        return AEC_RSI_OFFSETS_ERROR;
    } else {
        *count = vector_size(state->offsets);
    }
    return AEC_OK;
}